

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O2

void __thiscall
Corrade::Containers::StridedArrayView<4U,_char>::StridedArrayView
          (StridedArrayView<4U,_char> *this,ArrayView<void> data,char *member,Size<4U> *size,
          Stride<4U> *stride)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  size_t sVar8;
  ArrayView<void> local_50;
  anon_class_24_3_a165bac9 local_40;
  
  local_50._data = data._data;
  local_50._size = data._size;
  bVar7 = Implementation::isAnyDimensionZero<4u,unsigned_long,0ul,1ul,2ul,3ul>(size);
  if (!bVar7) {
    sVar8 = Implementation::largestStride<4u,0ul,1ul,2ul,3ul>(size,stride);
    if (data._size < sVar8) {
      local_40.data = &local_50;
      local_40.size = size;
      local_40.stride = stride;
      StridedArrayView::anon_class_24_3_a165bac9::operator()(&local_40);
    }
  }
  this->_data = member;
  uVar1 = size->_data[1];
  uVar2 = size->_data[2];
  uVar3 = size->_data[3];
  (this->_size)._data[0] = size->_data[0];
  (this->_size)._data[1] = uVar1;
  (this->_size)._data[2] = uVar2;
  (this->_size)._data[3] = uVar3;
  lVar4 = stride->_data[1];
  lVar5 = stride->_data[2];
  lVar6 = stride->_data[3];
  (this->_stride)._data[0] = stride->_data[0];
  (this->_stride)._data[1] = lVar4;
  (this->_stride)._data[2] = lVar5;
  (this->_stride)._data[3] = lVar6;
  return;
}

Assistant:

constexpr StridedArrayView<dimensions, T>::StridedArrayView(ArrayView<ErasedType> data, T* member, const Containers::Size<dimensions>& size, const Containers::Stride<dimensions>& stride) noexcept: _data{(
    /* A strided array view is usually not created from scratch in tight loops
       (except for slicing, which uses a different constructor) and should be
       as checked as possible, so it's not a debug assert */
    /** @todo can't compare void pointers to check if member is in data, it's
        not constexpr :( */
    /* If any size is zero, data can be zero-sized too. If the largest stride
       is zero, `data` can have *any* size and it could be okay, can't reliably
       test that */
    CORRADE_CONSTEXPR_ASSERT(Implementation::isAnyDimensionZero(size._data, typename Implementation::GenerateSequence<dimensions>::Type{}) || Implementation::largestStride(size._data, stride._data, typename Implementation::GenerateSequence<dimensions>::Type{}) <= data.size(),
        "Containers::StridedArrayView: data size" << data.size() << "is not enough for" << size << "elements of stride" << stride),
    #ifdef CORRADE_NO_ASSERT
    static_cast<void>(data),
    #endif
    member)}, _size{size}, _stride{stride} {}